

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutil.c
# Opt level: O3

void cCopy_CompCol_Matrix(SuperMatrix *A,SuperMatrix *B)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Dtype_t DVar5;
  Mtype_t MVar6;
  int_t iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  DVar5 = A->Dtype;
  MVar6 = A->Mtype;
  iVar7 = A->nrow;
  B->Stype = A->Stype;
  B->Dtype = DVar5;
  B->Mtype = MVar6;
  B->nrow = iVar7;
  uVar1 = A->ncol;
  B->ncol = uVar1;
  piVar3 = (int *)A->Store;
  piVar4 = (int *)B->Store;
  iVar2 = *piVar3;
  lVar8 = (long)iVar2;
  *piVar4 = iVar2;
  if (0 < lVar8) {
    lVar10 = 0;
    do {
      *(undefined8 *)(*(long *)(piVar4 + 2) + lVar10 * 8) =
           *(undefined8 *)(*(long *)(piVar3 + 2) + lVar10 * 8);
      lVar10 = lVar10 + 1;
    } while (lVar8 != lVar10);
    if (0 < iVar2) {
      lVar10 = *(long *)(piVar3 + 4);
      lVar9 = *(long *)(piVar4 + 4);
      lVar11 = 0;
      do {
        *(undefined4 *)(lVar9 + lVar11 * 4) = *(undefined4 *)(lVar10 + lVar11 * 4);
        lVar11 = lVar11 + 1;
      } while (lVar8 != lVar11);
    }
  }
  if (-1 < (int)uVar1) {
    lVar8 = *(long *)(piVar3 + 6);
    lVar10 = *(long *)(piVar4 + 6);
    lVar9 = 0;
    do {
      *(undefined4 *)(lVar10 + lVar9 * 4) = *(undefined4 *)(lVar8 + lVar9 * 4);
      lVar9 = lVar9 + 1;
    } while ((ulong)uVar1 + 1 != lVar9);
  }
  return;
}

Assistant:

void
cCopy_CompCol_Matrix(SuperMatrix *A, SuperMatrix *B)
{
    NCformat *Astore, *Bstore;
    int      ncol, nnz, i;

    B->Stype = A->Stype;
    B->Dtype = A->Dtype;
    B->Mtype = A->Mtype;
    B->nrow  = A->nrow;;
    B->ncol  = ncol = A->ncol;
    Astore   = (NCformat *) A->Store;
    Bstore   = (NCformat *) B->Store;
    Bstore->nnz = nnz = Astore->nnz;
    for (i = 0; i < nnz; ++i)
	((singlecomplex *)Bstore->nzval)[i] = ((singlecomplex *)Astore->nzval)[i];
    for (i = 0; i < nnz; ++i) Bstore->rowind[i] = Astore->rowind[i];
    for (i = 0; i <= ncol; ++i) Bstore->colptr[i] = Astore->colptr[i];
}